

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O0

void __thiscall NaDPlotFile::AppendRecord(NaDPlotFile *this)

{
  int iVar1;
  NaVector *pNVar2;
  long in_RDI;
  int iVar;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_c;
  
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  local_c = 0;
  while( true ) {
    iVar3 = local_c;
    iVar1 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 0x30));
    if (iVar1 <= iVar3) break;
    pNVar2 = NaDynAr<NaVector>::operator[]
                       ((NaDynAr<NaVector> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    (*pNVar2->_vptr_NaVector[4])(pNVar2,*(ulong *)(in_RDI + 0x18) & 0xffffffff);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void    NaDPlotFile::AppendRecord ()
{
    ++iCase;
    ++nRecords;
    int iVar;
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        aVars[iVar].new_dim(nRecords);
    }
}